

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O2

SQInteger __thiscall SQLexer::ReadNumber(SQLexer *this)

{
  sqvector<char,_unsigned_int> *this_00;
  byte bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  SQInteger SVar7;
  byte bVar8;
  long lVar9;
  bool bVar10;
  int i;
  ulong uVar11;
  char *pcVar12;
  long lStack_50;
  SQChar *sTemp;
  SQFloat value;
  
  bVar8 = this->_currdata;
  this_00 = &this->_longstr;
  sTemp._0_1_ = 0;
  sqvector<char,_unsigned_int>::resize(this_00,0,(char *)&sTemp);
  do {
    Next(this);
    lVar9 = this->_currentcolumn + 1;
    this->_currentcolumn = lVar9;
    bVar1 = this->_currdata;
  } while (bVar1 == 0x5f);
  if (bVar1 - 0x30 < 10 && bVar8 == 0x30) {
    iVar4 = (int)this->_tokencolumn;
    SQCompilation::SQCompilationContext::reportDiagnostic
              (this->_ctx,DI_OCTAL_NOT_SUPPORTED,(int32_t)this->_tokenline,iVar4,(int)lVar9 - iVar4)
    ;
    bVar1 = this->_currdata;
  }
  else if (bVar8 != 0x30) goto LAB_00130a2f;
  iVar4 = toupper((uint)bVar1);
  if (iVar4 == 0x58) {
    do {
      Next(this);
      lVar9 = this->_currentcolumn + 1;
      this->_currentcolumn = lVar9;
      bVar8 = this->_currdata;
    } while (bVar8 == 0x5f);
    while (iVar4 = isxdigit((uint)bVar8), iVar4 != 0) {
      sTemp._0_1_ = bVar8;
      sqvector<char,_unsigned_int>::push_back(this_00,(char *)&sTemp);
      do {
        Next(this);
        lVar9 = this->_currentcolumn + 1;
        this->_currentcolumn = lVar9;
        bVar8 = this->_currdata;
      } while (bVar8 == 0x5f);
    }
    uVar5 = (this->_longstr)._size;
    if (0x10 < uVar5) {
      iVar4 = (int)this->_tokencolumn;
      SQCompilation::SQCompilationContext::reportDiagnostic
                (this->_ctx,DI_HEX_TOO_MANY_DIGITS,(int32_t)this->_tokenline,iVar4,
                 (int)lVar9 - iVar4);
      uVar5 = (this->_longstr)._size;
    }
    if (uVar5 == 0) {
      iVar4 = (int)this->_tokencolumn;
      SQCompilation::SQCompilationContext::reportDiagnostic
                (this->_ctx,DI_HEX_DIGITS_EXPECTED,(int32_t)this->_tokenline,iVar4,
                 (int)this->_currentcolumn - iVar4);
    }
    sTemp._0_1_ = 0;
    sqvector<char,_unsigned_int>::push_back(this_00,(char *)&sTemp);
    pcVar12 = (this->_longstr)._vals;
    uVar11 = 0;
    do {
      this->_nvalue = uVar11;
      cVar2 = *pcVar12;
      iVar4 = (int)cVar2;
      do {
        if (cVar2 == '\0') {
          return 0x104;
        }
        if (iVar4 - 0x30U < 10) {
          uVar11 = uVar11 << 4 | (ulong)(iVar4 - 0x30U);
          goto LAB_00130d71;
        }
        iVar6 = isxdigit(iVar4);
      } while (iVar6 == 0);
      iVar4 = toupper(iVar4);
      uVar11 = (uVar11 * 0x10 + (long)iVar4) - 0x37;
LAB_00130d71:
      pcVar12 = pcVar12 + 1;
    } while( true );
  }
LAB_00130a2f:
  sTemp._0_1_ = bVar8;
  sqvector<char,_unsigned_int>::push_back(this_00,(char *)&sTemp);
  bVar8 = this->_currdata;
  lStack_50 = 1;
  bVar10 = false;
  bVar3 = false;
  do {
    if (bVar8 == 0x2e) {
      if ((bVar10) || (bVar3)) {
        iVar4 = (int)this->_tokencolumn;
        SQCompilation::SQCompilationContext::reportDiagnostic
                  (this->_ctx,DI_MALFORMED_NUMBER,(int32_t)this->_tokenline,iVar4,
                   (int)this->_currentcolumn - iVar4);
      }
      bVar10 = true;
      lStack_50 = 2;
    }
    else {
      iVar4 = isalnum((uint)bVar8);
      if (iVar4 == 0) {
        sTemp._0_1_ = 0;
        sqvector<char,_unsigned_int>::push_back(this_00,(char *)&sTemp);
        SVar7 = (*(code *)(&DAT_0016b8e0 + *(int *)(&DAT_0016b8e0 + (lStack_50 + -1) * 4)))();
        return SVar7;
      }
      if ((bVar8 & 0xdf) == 0x45) {
        if (bVar3) {
          iVar4 = (int)this->_tokencolumn;
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (this->_ctx,DI_MALFORMED_NUMBER,(int32_t)this->_tokenline,iVar4,
                     (int)this->_currentcolumn - iVar4);
          bVar8 = this->_currdata;
        }
        sTemp._0_1_ = bVar8;
        sqvector<char,_unsigned_int>::push_back(this_00,(char *)&sTemp);
        Next(this);
        lVar9 = this->_currentcolumn + 1;
        this->_currentcolumn = lVar9;
        bVar8 = this->_currdata;
        if ((bVar8 == 0x2d) || (bVar8 == 0x2b)) {
          sTemp._0_1_ = bVar8;
          sqvector<char,_unsigned_int>::push_back(this_00,(char *)&sTemp);
          Next(this);
          lVar9 = this->_currentcolumn + 1;
          this->_currentcolumn = lVar9;
          bVar8 = this->_currdata;
        }
        bVar3 = true;
        if (9 < bVar8 - 0x30) {
          iVar4 = (int)this->_tokencolumn;
          SQCompilation::SQCompilationContext::reportDiagnostic
                    (this->_ctx,DI_FP_EXP_EXPECTED,(int32_t)this->_tokenline,iVar4,
                     (int)lVar9 - iVar4);
        }
        lStack_50 = 4;
      }
    }
    bVar8 = this->_currdata;
    if ((9 < bVar8 - 0x30) &&
       ((0x37 < bVar8 - 0x2e || ((0x80000000800001U >> ((ulong)(bVar8 - 0x2e) & 0x3f) & 1) == 0))))
    {
      iVar4 = (int)this->_tokencolumn;
      SQCompilation::SQCompilationContext::reportDiagnostic
                (this->_ctx,DI_MALFORMED_NUMBER,(int32_t)this->_tokenline,iVar4,
                 (int)this->_currentcolumn - iVar4);
      bVar8 = this->_currdata;
    }
    sTemp._0_1_ = bVar8;
    sqvector<char,_unsigned_int>::push_back(this_00,(char *)&sTemp);
    do {
      Next(this);
      this->_currentcolumn = this->_currentcolumn + 1;
      bVar8 = this->_currdata;
    } while (bVar8 == 0x5f);
  } while( true );
}

Assistant:

SQInteger SQLexer::ReadNumber()
{
#define TINT 1
#define TFLOAT 2
#define THEX 3
#define TSCIENTIFIC 4

    SQInteger type = TINT, firstchar = CUR_CHAR;
    SQChar *sTemp;
    volatile SQFloat value;
    INIT_TEMP_STRING();
    NUM_NEXT();
    if(firstchar == _SC('0') && isdigit(CUR_CHAR))
        _ctx.reportDiagnostic(DiagnosticsId::DI_OCTAL_NOT_SUPPORTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
    if(firstchar == _SC('0') && (toupper(CUR_CHAR) == _SC('X')) ) {
        NUM_NEXT();
        type = THEX;
        while(isxdigit(CUR_CHAR)) {
            APPEND_CHAR(CUR_CHAR);
            NUM_NEXT();
        }
        if(_longstr.size() > MAX_HEX_DIGITS)
            _ctx.reportDiagnostic(DiagnosticsId::DI_HEX_TOO_MANY_DIGITS, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
        if(_longstr.size() == 0)
            _ctx.reportDiagnostic(DiagnosticsId::DI_HEX_DIGITS_EXPECTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
    }
    else {
        APPEND_CHAR((SQChar)firstchar);
        bool hasExp = false;
        bool hasDot = false;
        while (CUR_CHAR == _SC('.') || isalnum(CUR_CHAR)) {
            if(CUR_CHAR == _SC('.')) {
                if(hasDot || hasExp)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                hasDot = true;
                type = TFLOAT;
            }
            else if(isexponent(CUR_CHAR)) {
                if(hasExp)
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                hasExp = true;
                type = TSCIENTIFIC;
                APPEND_CHAR(CUR_CHAR);
                NEXT();
                if(CUR_CHAR == '+' || CUR_CHAR == '-'){
                    APPEND_CHAR(CUR_CHAR);
                    NEXT();
                }
                if(!isdigit(CUR_CHAR))
                    _ctx.reportDiagnostic(DiagnosticsId::DI_FP_EXP_EXPECTED, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
            }
            if(!isdigit(CUR_CHAR) && !isexponent(CUR_CHAR) && CUR_CHAR != '.')
                _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);

            APPEND_CHAR(CUR_CHAR);
            NUM_NEXT();
        }
    }
    TERMINATE_BUFFER();
    switch(type) {
    case TSCIENTIFIC:
    case TFLOAT:
#if SQ_USE_STD_FROM_CHARS
        {
            auto ret = std::from_chars(&_longstr[0], &_longstr[0] + _longstr.size(), _fvalue);
            if (ret.ec == std::errc::result_out_of_range)
                _ctx.reportDiagnostic(_fvalue == 0 ? DiagnosticsId::DI_LITERAL_UNDERFLOW : DiagnosticsId::DI_LITERAL_OVERFLOW,
                    _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");

            for (const char * c = ret.ptr; c < &_longstr[0] + _longstr.size() - 1; ++c)
                if (*c != '0')
                {
                    _ctx.reportDiagnostic(DiagnosticsId::DI_MALFORMED_NUMBER, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn);
                    break;
                }
        }
#else
        value = (SQFloat)strtod(&_longstr[0], &sTemp);
        _fvalue = value;
        if(value == 0)
        {
            for(int i = 0; i < _longstr.size(); i++)
            {
                SQChar c = _longstr[i];
                if (!c || c == 'e' || c == 'E')
                    break;
                if (c != '.' && c != '0')
                    _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_UNDERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
            }
        }
#endif

        if(sizeof(_fvalue) == sizeof(float))
        {
            if (_fvalue >= FLT_MAX)
                _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
        }
        else if(sizeof(_fvalue) == sizeof(double))
        {
            if (_fvalue >= DBL_MAX)
                _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "float");
        }
        return TK_FLOAT;
    case TINT:
        if(!LexInteger(&_longstr[0],(SQUnsignedInteger *)&_nvalue))
            _ctx.reportDiagnostic(DiagnosticsId::DI_LITERAL_OVERFLOW, _tokenline, _tokencolumn, _currentcolumn - _tokencolumn, "integer");
        return TK_INTEGER;
    case THEX:
        LexHexadecimal(&_longstr[0],(SQUnsignedInteger *)&_nvalue);
        return TK_INTEGER;
    }
    return 0;
}